

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_isa.c
# Opt level: O0

int main(int argc,char **argv)

{
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  int value_04;
  int value_05;
  int value_06;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int cc_neon;
  int cc_altivec;
  int cc_avx512vbmi;
  int cc_avx512bw;
  int cc_avx512f;
  int cc_avx2;
  int cc_sse41;
  int cc_sse2;
  int cpu_neon;
  int cpu_altivec;
  int cpu_avx512vbmi;
  int cpu_avx512bw;
  int cpu_avx512f;
  int cpu_avx2;
  int cpu_sse41;
  int cpu_sse2;
  char **argv_local;
  int argc_local;
  
  value = parasail_can_use_sse2();
  value_00 = parasail_can_use_sse41();
  value_01 = parasail_can_use_avx2();
  value_02 = parasail_can_use_avx512f();
  value_03 = parasail_can_use_avx512bw();
  value_04 = parasail_can_use_avx512vbmi();
  value_05 = parasail_can_use_altivec();
  value_06 = parasail_can_use_neon();
  __cpu_indicator_init();
  printf(" ISA        | Compiler | CPU | __builtin_cpu_supports\n");
  printf("------------------------------------------------------\n");
  pcVar1 = yesno(1);
  pcVar2 = yesno(value);
  pcVar3 = yesno((uint)((DAT_0010509c & 0x10) == 0x10));
  printf(" SSE2       |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  pcVar1 = yesno(1);
  pcVar2 = yesno(value_00);
  pcVar3 = yesno((uint)((DAT_0010509c & 0x80) == 0x80));
  printf(" SSE41      |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  pcVar1 = yesno(1);
  pcVar2 = yesno(value_01);
  pcVar3 = yesno((uint)((DAT_0010509c & 0x400) == 0x400));
  printf(" AVX2       |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  pcVar1 = yesno(0);
  pcVar2 = yesno(value_02);
  pcVar3 = yesno(0);
  printf(" AVX512F    |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  pcVar1 = yesno(0);
  pcVar2 = yesno(value_03);
  pcVar3 = yesno(0);
  printf(" AVX512BW   |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  pcVar1 = yesno(0);
  pcVar2 = yesno(value_04);
  pcVar3 = yesno(0);
  printf(" AVX512VBMI |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  pcVar1 = yesno(0);
  pcVar2 = yesno(value_05);
  pcVar3 = yesno(0);
  printf(" ALTIVEC    |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  pcVar1 = yesno(0);
  pcVar2 = yesno(value_06);
  pcVar3 = yesno(0);
  printf(" NEON       |  %s     | %s | %s\n",pcVar1,pcVar2,pcVar3);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int cpu_sse2;
    int cpu_sse41;
    int cpu_avx2;
    int cpu_avx512f;
    int cpu_avx512bw;
    int cpu_avx512vbmi;
    int cpu_altivec;
    int cpu_neon;
    int cc_sse2;
    int cc_sse41;
    int cc_avx2;
    int cc_avx512f;
    int cc_avx512bw;
    int cc_avx512vbmi;
    int cc_altivec;
    int cc_neon;

    UNUSED(argc);
    UNUSED(argv);

    cpu_sse2 = parasail_can_use_sse2();
    cpu_sse41 = parasail_can_use_sse41();
    cpu_avx2 = parasail_can_use_avx2();
    cpu_avx512f = parasail_can_use_avx512f();
    cpu_avx512bw = parasail_can_use_avx512bw();
    cpu_avx512vbmi = parasail_can_use_avx512vbmi();
    cpu_altivec = parasail_can_use_altivec();
    cpu_neon = parasail_can_use_neon();

#if HAVE_SSE2
    cc_sse2 = 1;
#else
    cc_sse2 = 0;
#endif

#if HAVE_SSE41
    cc_sse41 = 1;
#else
    cc_sse41 = 0;
#endif

#if HAVE_AVX2
    cc_avx2 = 1;
#else
    cc_avx2 = 0;
#endif

#if HAVE_AVX512F
    cc_avx512f = 1;
#else
    cc_avx512f = 0;
#endif

#if HAVE_AVX512BW
    cc_avx512bw = 1;
#else
    cc_avx512bw = 0;
#endif

#if HAVE_AVX512VBMI
    cc_avx512vbmi = 1;
#else
    cc_avx512vbmi = 0;
#endif

#if HAVE_ALTIVEC
    cc_altivec = 1;
#else
    cc_altivec = 0;
#endif

#if HAVE_NEON
    cc_neon = 1;
#else
    cc_neon = 0;
#endif

#ifdef HAVE___BUILTIN_CPU_SUPPORTS
#ifdef HAVE___BUILTIN_CPU_INIT
    __builtin_cpu_init();
#endif
    printf(" ISA        | Compiler | CPU | __builtin_cpu_supports\n");
    printf("------------------------------------------------------\n");
    printf(" SSE2       |  %s     | %s | %s\n", yesno(cc_sse2), yesno(cpu_sse2), yesno(__builtin_cpu_supports("sse2")));
    printf(" SSE41      |  %s     | %s | %s\n", yesno(cc_sse41), yesno(cpu_sse41), yesno(__builtin_cpu_supports("sse4.1")));
    printf(" AVX2       |  %s     | %s | %s\n", yesno(cc_avx2), yesno(cpu_avx2), yesno(__builtin_cpu_supports("avx2")));
    printf(" AVX512F    |  %s     | %s | %s\n", yesno(cc_avx512f), yesno(cpu_avx512f), yesno(0));
    printf(" AVX512BW   |  %s     | %s | %s\n", yesno(cc_avx512bw), yesno(cpu_avx512bw), yesno(0));
    printf(" AVX512VBMI |  %s     | %s | %s\n", yesno(cc_avx512vbmi), yesno(cpu_avx512vbmi), yesno(0));
    printf(" ALTIVEC    |  %s     | %s | %s\n", yesno(cc_altivec), yesno(cpu_altivec), yesno(0));
    printf(" NEON       |  %s     | %s | %s\n", yesno(cc_neon), yesno(cpu_neon), yesno(0));
#else
    printf(" ISA        | Compiler | CPU  \n");
    printf("------------------------------\n");
    printf(" SSE2       |  %s     | %s\n", yesno(cc_sse2), yesno(cpu_sse2));
    printf(" SSE41      |  %s     | %s\n", yesno(cc_sse41), yesno(cpu_sse41));
    printf(" AVX2       |  %s     | %s\n", yesno(cc_avx2), yesno(cpu_avx2));
    printf(" AVX512F    |  %s     | %s\n", yesno(cc_avx512f), yesno(cpu_avx512f));
    printf(" AVX512BW   |  %s     | %s\n", yesno(cc_avx512bw), yesno(cpu_avx512bw));
    printf(" AVX512VBMI |  %s     | %s\n", yesno(cc_avx512vbmi), yesno(cpu_avx512vbmi));
    printf(" ALTIVEC    |  %s     | %s\n", yesno(cc_altivec), yesno(cpu_altivec));
    printf(" NEON       |  %s     | %s\n", yesno(cc_neon), yesno(cpu_neon));
#endif

    return 0;
}